

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_reservoir_sample.cpp
# Opt level: O3

double duckdb::BaseReservoirSampling::GetMinWeightFromTuplesSeen(idx_t rows_seen_total)

{
  double dVar1;
  undefined1 auVar2 [16];
  
  if (rows_seen_total < 4) {
    return *(double *)(&DAT_01e122e8 + rows_seen_total * 8);
  }
  auVar2._8_4_ = (int)(rows_seen_total >> 0x20);
  auVar2._0_8_ = rows_seen_total;
  auVar2._12_4_ = 0x45300000;
  dVar1 = exp(((auVar2._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)rows_seen_total) - 4503599627370496.0)) * -0.07);
  return dVar1 * -0.355 + 0.99;
}

Assistant:

double BaseReservoirSampling::GetMinWeightFromTuplesSeen(idx_t rows_seen_total) {
	// this function was obtained using https://mycurvefit.com. Inputting multiple x, y values into
	// The
	switch (rows_seen_total) {
	case 0:
		return 0;
	case 1:
		return 0.000161;
	case 2:
		return 0.530136;
	case 3:
		return 0.693454;
	default: {
		return (0.99 - 0.355 * std::exp(-0.07 * static_cast<double>(rows_seen_total)));
	}
	}
}